

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_range(connectdata *conn)

{
  Curl_easy *pCVar1;
  ushort **ppuVar2;
  bool bVar3;
  Curl_easy *data;
  char *ptr2;
  char *ptr;
  curl_off_t totalsize;
  curl_off_t to;
  curl_off_t from;
  connectdata *conn_local;
  
  ptr = (char *)0xffffffffffffffff;
  pCVar1 = conn->data;
  if ((((pCVar1->state).use_range & 1U) == 0) || ((pCVar1->state).range == (char *)0x0)) {
    (pCVar1->req).maxdownload = -1;
  }
  else {
    from = (curl_off_t)conn;
    to = strtol((pCVar1->state).range,&ptr2,0);
    while( true ) {
      bVar3 = false;
      if (*ptr2 != '\0') {
        ppuVar2 = __ctype_b_loc();
        bVar3 = true;
        if (((*ppuVar2)[(int)(uint)(byte)*ptr2] & 0x2000) == 0) {
          bVar3 = *ptr2 == '-';
        }
      }
      if (!bVar3) break;
      ptr2 = ptr2 + 1;
    }
    totalsize = strtol(ptr2,(char **)&data,0);
    if ((Curl_easy *)ptr2 == data) {
      totalsize = -1;
    }
    if ((totalsize == -1) && (-1 < to)) {
      (pCVar1->state).resume_from = to;
    }
    else if (to < 0) {
      (pCVar1->req).maxdownload = -to;
      (pCVar1->state).resume_from = to;
    }
    else {
      (pCVar1->req).maxdownload = (totalsize - to) + 1;
      (pCVar1->state).resume_from = to;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode file_range(struct connectdata *conn)
{
  curl_off_t from, to;
  curl_off_t totalsize=-1;
  char *ptr;
  char *ptr2;
  struct Curl_easy *data = conn->data;

  if(data->state.use_range && data->state.range) {
    from=curlx_strtoofft(data->state.range, &ptr, 0);
    while(*ptr && (ISSPACE(*ptr) || (*ptr=='-')))
      ptr++;
    to=curlx_strtoofft(ptr, &ptr2, 0);
    if(ptr == ptr2) {
      /* we didn't get any digit */
      to=-1;
    }
    if((-1 == to) && (from>=0)) {
      /* X - */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE %" CURL_FORMAT_CURL_OFF_T " to end of file\n",
                   from));
    }
    else if(from < 0) {
      /* -Y */
      data->req.maxdownload = -from;
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE the last %" CURL_FORMAT_CURL_OFF_T " bytes\n",
                   -from));
    }
    else {
      /* X-Y */
      totalsize = to-from;
      data->req.maxdownload = totalsize+1; /* include last byte */
      data->state.resume_from = from;
      DEBUGF(infof(data, "RANGE from %" CURL_FORMAT_CURL_OFF_T
                   " getting %" CURL_FORMAT_CURL_OFF_T " bytes\n",
                   from, data->req.maxdownload));
    }
    DEBUGF(infof(data, "range-download from %" CURL_FORMAT_CURL_OFF_T
                 " to %" CURL_FORMAT_CURL_OFF_T ", totally %"
                 CURL_FORMAT_CURL_OFF_T " bytes\n",
                 from, to, data->req.maxdownload));
  }
  else
    data->req.maxdownload = -1;
  return CURLE_OK;
}